

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wlcBlast.c
# Opt level: O3

void Wlc_BlastSqrt(Gia_Man_t *pNew,int *pNum,int nNum,Vec_Int_t *vTmp,Vec_Int_t *vRes)

{
  int *piVar1;
  int iVar2;
  Gia_Man_t *p;
  int *piVar3;
  uint *puVar4;
  int iVar5;
  int *piVar6;
  int iVar7;
  long lVar8;
  uint uVar9;
  ulong uVar10;
  ulong uVar11;
  uint uVar12;
  uint *puVar13;
  int Carry;
  uint local_8c;
  Gia_Man_t *local_88;
  Vec_Int_t *local_80;
  ulong local_78;
  int *local_70;
  uint *local_68;
  long local_60;
  ulong local_58;
  int *local_50;
  ulong local_48;
  long local_40;
  uint *local_38;
  
  local_8c = 0xffffffff;
  local_88 = pNew;
  local_50 = pNum;
  if ((nNum & 1U) != 0) {
    __assert_fail("nNum % 2 == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/wlc/wlcBlast.c"
                  ,0x2fb,"void Wlc_BlastSqrt(Gia_Man_t *, int *, int, Vec_Int_t *, Vec_Int_t *)");
  }
  uVar9 = nNum >> 1;
  if (vRes->nCap < (int)uVar9) {
    if (vRes->pArray == (int *)0x0) {
      piVar6 = (int *)malloc((long)(int)uVar9 << 2);
    }
    else {
      piVar6 = (int *)realloc(vRes->pArray,(long)(int)uVar9 << 2);
    }
    vRes->pArray = piVar6;
    if (piVar6 == (int *)0x0) goto LAB_0089e489;
    vRes->nCap = uVar9;
  }
  uVar10 = (ulong)uVar9;
  if (0 < (int)uVar9) {
    memset(vRes->pArray,0,uVar10 * 4);
  }
  vRes->nSize = uVar9;
  uVar12 = nNum * 2;
  if (vTmp->nCap < (int)uVar12) {
    if (vTmp->pArray == (int *)0x0) {
      piVar6 = (int *)malloc((long)(int)uVar12 << 2);
    }
    else {
      piVar6 = (int *)realloc(vTmp->pArray,(long)(int)uVar12 << 2);
    }
    vTmp->pArray = piVar6;
    if (piVar6 == (int *)0x0) {
LAB_0089e489:
      __assert_fail("p->pArray",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                    ,0x217,"void Vec_IntGrow(Vec_Int_t *, int)");
    }
    vTmp->nCap = uVar12;
  }
  piVar6 = vTmp->pArray;
  local_80 = vRes;
  local_58 = uVar10;
  if (0 < nNum) {
    memset(piVar6,0,(ulong)uVar12 << 2);
  }
  vTmp->nSize = uVar12;
  if (0 < (int)uVar9) {
    local_38 = (uint *)local_80->pArray;
    local_60 = (long)nNum;
    piVar1 = piVar6 + local_60;
    local_78 = 3;
    local_40 = 1;
    uVar10 = 0;
    local_70 = piVar6;
    local_68 = local_38;
    do {
      puVar13 = local_38 + 1;
      lVar8 = local_60 + uVar10 * -2;
      *piVar1 = local_50[lVar8 + -2];
      piVar1[1] = local_50[lVar8 + -1];
      lVar8 = 0;
      do {
        piVar1[lVar8 + 2] = piVar6[lVar8];
        lVar8 = lVar8 + 1;
      } while (local_40 != lVar8);
      local_48 = uVar10 + 1;
      uVar11 = 0;
      local_38 = puVar13;
      do {
        if (uVar11 < uVar10 + 2 && 1 < uVar11) {
          uVar9 = *puVar13;
          if ((int)uVar9 < 0) goto LAB_0089e44b;
          iVar5 = piVar1[uVar11];
          uVar12 = local_8c;
        }
        else {
          uVar9 = 1;
          if (uVar11 != 0) {
            uVar9 = local_8c;
          }
          if ((int)uVar9 < 0) goto LAB_0089e44b;
          iVar5 = piVar1[uVar11];
          uVar12 = 1;
        }
        Wlc_BlastFullAdder(local_88,iVar5,uVar9 ^ 1,uVar12,(int *)&local_8c,piVar6);
        puVar4 = local_68;
        piVar3 = local_70;
        p = local_88;
        if (uVar10 <= (int)uVar11 - 1) {
          if ((int)local_8c < 0) goto LAB_0089e44b;
          local_8c = local_8c ^ 1;
        }
        uVar11 = uVar11 + 1;
        piVar6 = piVar6 + 1;
        puVar13 = puVar13 + -1;
      } while (local_78 != uVar11);
      if ((int)local_8c < 0) {
LAB_0089e44b:
        __assert_fail("Lit >= 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/abc_global.h"
                      ,0x131,"int Abc_LitNot(int)");
      }
      local_68[uVar10] = local_8c ^ 1;
      uVar11 = 0;
      do {
        iVar5 = Gia_ManHashMux(p,puVar4[uVar10],piVar3[uVar11],piVar1[uVar11]);
        piVar3[uVar11] = iVar5;
        uVar11 = uVar11 + 1;
      } while (local_78 != uVar11);
      local_40 = local_40 + 1;
      local_78 = local_78 + 1;
      uVar10 = local_48;
      piVar6 = piVar3;
    } while (local_48 != local_58);
  }
  iVar5 = local_80->nSize;
  if (1 < iVar5) {
    piVar6 = local_80->pArray;
    iVar7 = -1;
    lVar8 = 0;
    do {
      iVar2 = piVar6[lVar8];
      piVar6[lVar8] = piVar6[iVar5 + iVar7];
      piVar6[local_80->nSize + iVar7] = iVar2;
      lVar8 = lVar8 + 1;
      iVar5 = local_80->nSize;
      iVar7 = iVar7 + -1;
    } while (lVar8 < iVar5 / 2);
  }
  return;
}

Assistant:

void Wlc_BlastSqrt( Gia_Man_t * pNew, int * pNum, int nNum, Vec_Int_t * vTmp, Vec_Int_t * vRes )
{
    int * pRes, * pSum, * pSumP;
    int i, k, Carry = -1;
    assert( nNum % 2 == 0 );
    Vec_IntFill( vRes, nNum/2, 0 );
    Vec_IntFill( vTmp, 2*nNum, 0 );
    pRes = Vec_IntArray( vRes );
    pSum = Vec_IntArray( vTmp );
    pSumP = pSum + nNum;
    for ( i = 0; i < nNum/2; i++ )
    {
        pSumP[0] = pNum[nNum-2*i-2];
        pSumP[1] = pNum[nNum-2*i-1];
        for ( k = 0; k < i+1; k++ )
            pSumP[k+2] = pSum[k];
        for ( k = 0; k < i + 3; k++ )
        {
            if ( k >= 2 && k < i + 2 ) // middle ones
                Wlc_BlastFullAdder( pNew, pSumP[k], Abc_LitNot(pRes[i-k+1]), Carry, &Carry, &pSum[k] );
            else
                Wlc_BlastFullAdder( pNew, pSumP[k], Abc_LitNot(k ? Carry:1), 1,     &Carry, &pSum[k] );
            if ( k == 0 || k > i )
                Carry = Abc_LitNot(Carry);
        }
        pRes[i] = Abc_LitNot(Carry);
        for ( k = 0; k < i + 3; k++ )
            pSum[k] = Gia_ManHashMux( pNew, pRes[i], pSum[k], pSumP[k] );
    }
    Vec_IntReverseOrder( vRes );
}